

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_map_suite.cpp
# Opt level: O2

void api_suite::api_ctor_array(void)

{
  array<vista::pair<int,_int>,_4UL> expect;
  constant_map<int,_int,_4UL,_std::less<int>_> map;
  pair<int,_int> input [4];
  
  input[2].first = 0x21;
  input[2].second = 3;
  input[3].first = 0xb;
  input[3].second = 1;
  input[0].first = 0x16;
  input[0].second = 2;
  input[1].first = 0x2c;
  input[1].second = 4;
  vista::constant_map<int,_int,_4UL,_std::less<int>_>::constant_map(&map,&input);
  expect._M_elems[2].first = 0x21;
  expect._M_elems[2].second = 3;
  expect._M_elems[3].first = 0x2c;
  expect._M_elems[3].second = 4;
  expect._M_elems[0].first = 0xb;
  expect._M_elems[0].second = 1;
  expect._M_elems[1].first = 0x16;
  expect._M_elems[1].second = 2;
  boost::detail::test_all_eq_impl<std::ostream,vista::pair<int,int>*,vista::pair<int,int>*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x36,"void api_suite::api_ctor_array()",(pair<int,_int> *)&map,input,expect._M_elems,
             (pair<int,_int> *)&map);
  return;
}

Assistant:

void api_ctor_array()
{
    pair<int, int> input[4] = { { 22, 2 }, { 44, 4 }, { 33, 3 }, { 11, 1 } };
    constant_map<int, int, 4> map(std::move(input));
    {
        std::array<pair<int, int>, 4> expect = {
            pair<int, int>{ 11, 1 },
            pair<int, int>{ 22, 2 },
            pair<int, int>{ 33, 3 },
            pair<int, int>{ 44, 4 }
        };
        BOOST_TEST_ALL_EQ(map.begin(), map.end(),
                          expect.begin(), expect.end());
    }
}